

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

ON__UINT32
MapCodePointOrdinal(ON__UINT32 unicode_code_point,uint maximum_singleton_value,
                   ON_StringMapOrdinalType map_type)

{
  ON__UINT32 OVar1;
  bool bVar2;
  
  if (maximum_singleton_value < unicode_code_point || unicode_code_point < 0x41) {
    return unicode_code_point;
  }
  if (0x5a < unicode_code_point) {
    if (unicode_code_point < 0x61) {
      return unicode_code_point;
    }
    if (unicode_code_point < 0x7b) {
      if ((map_type != MinimumOrdinal) && (map_type != UpperOrdinal)) {
        return unicode_code_point;
      }
      return unicode_code_point - 0x20;
    }
    if (unicode_code_point < 0xc0) {
      return unicode_code_point;
    }
    if (unicode_code_point < 0xdf) {
      if (unicode_code_point == 0xd7) {
        return 0xd7;
      }
    }
    else {
      if (unicode_code_point == 0xdf) {
        return 0xdf;
      }
      if (unicode_code_point < 0xff) {
        if (unicode_code_point == 0xf7) {
          return 0xf7;
        }
LAB_005c391c:
        OVar1 = unicode_code_point - 0x20;
        bVar2 = (map_type & ~LowerOrdinal) == UpperOrdinal;
        goto LAB_005c38bd;
      }
      if (unicode_code_point == 0xff) {
        OVar1 = 0xff;
        if (map_type == UpperOrdinal) {
          OVar1 = 0x178;
        }
        if (maximum_singleton_value < 0x178) {
          OVar1 = 0xff;
        }
        return OVar1;
      }
      if (unicode_code_point < 0x180) {
        if ((int)unicode_code_point < 0x149) {
          if (unicode_code_point == 0x130) {
            bVar2 = (map_type & ~UpperOrdinal) == LowerOrdinal;
            OVar1 = 0x69;
LAB_005c3b1d:
            if (bVar2) {
              unicode_code_point = OVar1;
            }
            return unicode_code_point;
          }
          if (unicode_code_point == 0x131) {
            bVar2 = (map_type & ~LowerOrdinal) == UpperOrdinal;
            OVar1 = 0x49;
            goto LAB_005c3b1d;
          }
          if (unicode_code_point == 0x138) {
            return 0x138;
          }
        }
        else {
          if (unicode_code_point == 0x149) {
            bVar2 = (map_type & ~LowerOrdinal) == UpperOrdinal;
            OVar1 = 0x4e;
            goto LAB_005c3b1d;
          }
          if (unicode_code_point == 0x178) {
            bVar2 = (map_type & ~UpperOrdinal) == LowerOrdinal;
            OVar1 = 0xff;
            goto LAB_005c3b1d;
          }
          if (unicode_code_point == 0x17f) {
            return 0x17f;
          }
        }
        if (0x2d < unicode_code_point - 0x14a && 0x137 < unicode_code_point) {
          if ((unicode_code_point & 1) != 0) {
            return (map_type == LowerOrdinal) + unicode_code_point;
          }
          goto LAB_005c3aef;
        }
LAB_005c39fc:
        if ((unicode_code_point & 1) == 0) {
          return map_type == LowerOrdinal | unicode_code_point;
        }
LAB_005c3aef:
        return unicode_code_point - ((map_type & ~LowerOrdinal) == UpperOrdinal);
      }
      if (unicode_code_point < 0x200) {
        switch(unicode_code_point) {
        case 0x193:
          bVar2 = map_type == LowerOrdinal;
          OVar1 = 0x260;
          break;
        case 0x194:
          bVar2 = map_type == LowerOrdinal;
          OVar1 = 0x263;
          break;
        case 0x195:
          bVar2 = map_type == UpperOrdinal;
          OVar1 = 0x1f6;
          break;
        case 0x196:
          bVar2 = map_type == LowerOrdinal;
          OVar1 = 0x269;
          break;
        case 0x197:
          bVar2 = map_type == LowerOrdinal;
          OVar1 = 0x268;
          break;
        default:
          if (unicode_code_point != 0x180) {
            return unicode_code_point;
          }
          bVar2 = map_type == UpperOrdinal;
          OVar1 = 0x243;
        }
        goto LAB_005c3b1d;
      }
      if (unicode_code_point < 0x370) {
        return unicode_code_point;
      }
      if (unicode_code_point < 0x400) {
        if (0x18 < unicode_code_point - 0x391) {
          if (unicode_code_point - 0x3b1 < 0x19) {
            if (unicode_code_point == 0x3c2) {
              return 0x3c2;
            }
            goto LAB_005c391c;
          }
          if (0x377 < unicode_code_point) {
            if (unicode_code_point < 0x37e) {
              OVar1 = unicode_code_point + 0x82;
              if (map_type != UpperOrdinal) {
                OVar1 = unicode_code_point;
              }
              if (unicode_code_point < 0x37b) {
                OVar1 = unicode_code_point;
              }
              return OVar1;
            }
            if ((unicode_code_point != 0x3f3) && (unicode_code_point != 0x37f)) {
              return unicode_code_point;
            }
            bVar2 = map_type == LowerOrdinal && unicode_code_point == 0x37f;
            OVar1 = 0x3f3;
            goto LAB_005c38bd;
          }
          if ((unicode_code_point & 0x3fe) == 0x374) {
            return unicode_code_point;
          }
          goto LAB_005c39fc;
        }
        if (unicode_code_point == 0x3a2) {
          return 0x3a2;
        }
      }
      else if (unicode_code_point < 0x500) {
        if (unicode_code_point < 0x410) {
          return unicode_code_point;
        }
        if (0x42f < unicode_code_point) {
          OVar1 = unicode_code_point - 0x20;
          if ((map_type & ~LowerOrdinal) != UpperOrdinal) {
            OVar1 = unicode_code_point;
          }
          bVar2 = unicode_code_point < 0x450;
LAB_005c3b78:
          if (!bVar2) {
            OVar1 = unicode_code_point;
          }
          return OVar1;
        }
      }
      else {
        if (unicode_code_point - 0xfff0 < 0xffffff31) {
          return unicode_code_point;
        }
        if (0xff3a < unicode_code_point) {
          OVar1 = unicode_code_point - 0x20;
          if ((map_type & ~LowerOrdinal) != UpperOrdinal) {
            OVar1 = unicode_code_point;
          }
          bVar2 = unicode_code_point - 0xff42 < 0x19;
          goto LAB_005c3b78;
        }
      }
    }
  }
  OVar1 = unicode_code_point + 0x20;
  bVar2 = map_type == LowerOrdinal;
LAB_005c38bd:
  if (!bVar2) {
    OVar1 = unicode_code_point;
  }
  return OVar1;
}

Assistant:

static ON__UINT32 MapCodePointOrdinal(
  ON__UINT32 unicode_code_point,
  unsigned int maximum_singleton_value,
  ON_StringMapOrdinalType map_type
  )
{
  // Converts ordinal "char" and "wchar_t" element values in the
  // range 0x00 to maximum_singleton_value to "ignore case" ordinal equivalents.
  // The returned value is always <= input value.
  //
  // This is NOT linguistic and NOT culture invariant.
  //
  // For UTF-8 strings, maximum_singleton_value = 0x7FU
  // For UTF-16 strings, maximum_singleton_value = 0xFFFFU
  // For UTF-32 strings, maximum_singleton_value = 0xFFFFFFFFU

  // TODO
  //   Should ordinal ignore case compares this modify any values > 0x00FFU?

  if (unicode_code_point < 0x0041U || unicode_code_point > maximum_singleton_value)
    return unicode_code_point;

  if (unicode_code_point <= 0x005AU)
  {
    // unicode_code_points U+0041 = capital A to U+005A = capital Z
    if (ON_StringMapOrdinalType::LowerOrdinal == map_type)
    {
      return unicode_code_point + 0x20;
    }
    return unicode_code_point;
  }

  if (unicode_code_point < 0x0061U)
  {
    // unicode_code_points for the the six glyphs
    // U+005B [
    // U+005C \
    // U+005D ]
    // U+005E ^
    // U+005F _
    // U+0060 `
    // These are the ASCII symbols after capital Z and before lower case A (a)
    // that were inserted so that converting between A...Z and a...z
    // could be done by setting/clearing a single bit 0x20.
    // The first edition of the ASCII standard was published in 1963.
    return unicode_code_point;
  }

  if (unicode_code_point <= 0x007AU)
  {
    // unicode_code_points u+0061 = lower case A (a) to U+007A = lower case Z (z)

    if (ON_StringMapOrdinalType::UpperOrdinal == map_type)
    {
      return unicode_code_point - 0x20;
    }

    if (ON_StringMapOrdinalType::MinimumOrdinal == map_type)
    {
      return unicode_code_point - 0x20;
    }

    return unicode_code_point;
  }

  if ( unicode_code_point < 0x00C0U )
    return unicode_code_point;

  if (unicode_code_point <= 0x00DE)
  {
    // 0x00C0: LATIN CAPITAL LETTER A WITH GRAVE
    // ...
    // 0x00D7: MULTIPLICATION SIGN
    // ...
    // 0x00DE: LATIN CAPITAL LETTER THORN
    if ( unicode_code_point == 0x00D7 )
      return unicode_code_point; // MULTIPLICATION SIGN

    if ( ON_StringMapOrdinalType::LowerOrdinal == map_type)
      return unicode_code_point + 0x20;

    return unicode_code_point;
  }

  if (unicode_code_point < 0x00E0U)
    return unicode_code_point;

  if (unicode_code_point <= 0x00FEU)
  {
    // 0x00E0: LATIN SMALL LETTER A WITH GRAVE
    // ...
    // 0x00F7: DIVISION SIGN
    // ...
    // 0x00FE: LATIN SMALL LETTER THORN
    if (0x00F7U == unicode_code_point)
      return unicode_code_point; // DIVISION SIGN

    if ( ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::UpperOrdinal == map_type )
      return unicode_code_point - 0x20;
    return unicode_code_point;
  }

  if (unicode_code_point <= 0x00FFU)
  {
    // 0x00FFU: LATIN SMALL LETTER Y WITH DIAERESIS
    if ( ON_StringMapOrdinalType::UpperOrdinal == map_type && 0x0178U <= maximum_singleton_value )
      return 0x0178U; // 0x0178U: LATIN CAPITAL LETTER Y WITH DIAERESIS
    return unicode_code_point;
  }

  if (unicode_code_point <= 0x017FU)
  {
    // Latin Extended-A

    // special cases
    switch (unicode_code_point)
    {
    case 0x0130U: // LATIN CAPITAL LETTER I WITH DOT ABOVE
      if (ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::LowerOrdinal == map_type)
        return 0x0069U; // 0x0069U: LATIN SMALL LETTER i
      return unicode_code_point;
      break;

    case 0x0131U: // LATIN SMALL LETTER DOTLESS I
      if (ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::UpperOrdinal == map_type)
        return 0x0049U; // 0x0049U LATIN CAPITAL LETTER I
      return unicode_code_point;
      break;

    case 0x0138U: // LATIN SMALL LETTER KRA
      // No upper case ordinal
      return unicode_code_point;
      break;

    case 0x0149U: // LATIN SMALL LETTER N PRECEDED BY APOSTROPHE
      if (ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::UpperOrdinal == map_type)
        return 0x004EU; // 0x004EU LATIN CAPITAL LETTER N
      return unicode_code_point;
      break;

    case 0x0178U: // LATIN CAPITAL LETTER Y WITH DIAERESIS
      if ( ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::LowerOrdinal == map_type )
        return 0x00FFU; // 0x00FFU: LATIN SMALL LETTER Y WITH DIAERESIS
      return unicode_code_point;
      break;

    case 0x017FU: // LATIN SMALL LETTER LONG S
      // No upper case ordinal
      return unicode_code_point;
      break;
    }

    if (unicode_code_point < 0x0138U || (unicode_code_point >= 0x014AU && unicode_code_point < 0x0178U) )
    {
      // CAPITALS are even and SMALL is CAPITAL+1
      if (0 == (unicode_code_point % 2))
      {
        // LATIN CAPITAL LETTER
        if (ON_StringMapOrdinalType::LowerOrdinal == map_type)
          return unicode_code_point + 1;
      }
      else
      {
        // LATIN SMALL LETTER
        if (ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::UpperOrdinal == map_type)
          return unicode_code_point - 1;
      }
      return unicode_code_point;
    }
    else
    {
      // CAPITALS are odd and SMALL is CAPITAL+1
      if (1 == (unicode_code_point % 2))
      {
        // LATIN CAPITAL LETTER
        if (ON_StringMapOrdinalType::LowerOrdinal == map_type)
          return unicode_code_point + 1;
      }
      else
      {
        // LATIN SMALL LETTER
        if (ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::UpperOrdinal == map_type)
          return unicode_code_point - 1;
      }
    }

    return unicode_code_point;
  }


  if (unicode_code_point <= 0x01FFU)
  {
    // Latin Extended-B

    // special cases
    switch (unicode_code_point)
    {
    case 0x0180U: // LATIN SMALL LETTER B WITH STROKE
      if (ON_StringMapOrdinalType::UpperOrdinal == map_type)
        return 0x0243U;
      return unicode_code_point;
      break;
    case 0x0193U: // LATIN CAPITAL LETTER G WITH HOOK
      if (ON_StringMapOrdinalType::LowerOrdinal == map_type)
        return 0x0260U;
      return unicode_code_point;
      break;
    case 0x0194U: // LATIN CAPITAL LETTER GAMMA
      if (ON_StringMapOrdinalType::LowerOrdinal == map_type)
        return 0x0263U;
      return unicode_code_point;
      break;
    case 0x0195U: // LATIN SMALL LETTER HV
      if (ON_StringMapOrdinalType::UpperOrdinal == map_type)
        return 0x01F6U;
      return unicode_code_point;
      break;
    case 0x0196U: // LATIN CAPITAL LETTER IOTA
      if (ON_StringMapOrdinalType::LowerOrdinal == map_type)
        return 0x0269U;
      return unicode_code_point;
      break;
    case 0x0197U: // LATIN CAPITAL LETTER I WITH STROKE
      if (ON_StringMapOrdinalType::LowerOrdinal == map_type)
        return 0x0268U;
      return unicode_code_point;
      break;
    }

    // TODO

    return unicode_code_point;
  }



  if (unicode_code_point < 0x0370)
    return unicode_code_point;

  if (unicode_code_point <= 0x03FF)
  {
    // Greek and Coptic
    if (unicode_code_point >= 0x0391 && unicode_code_point <= 0x03A9)
    {
      // GREEK CAPITAL LETTER ALPHA ... OMEGA
      if ( 0x03A2 == unicode_code_point )
        return unicode_code_point; // RESERVED
      if ( ON_StringMapOrdinalType::LowerOrdinal == map_type)
        return unicode_code_point + 0x20;
      return unicode_code_point;
    }

    if (unicode_code_point >= 0x03B1 && unicode_code_point <= 0x03C9)
    {
      // GREEK SMALL LETTER ALPHA ... OMEGA
      if ( 0x03C2 == unicode_code_point )
        return unicode_code_point; // GREEK SMALL LETTER FINAL SIGMA (stigma)
      if ( ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::UpperOrdinal == map_type )
        return unicode_code_point - 0x20;
      return unicode_code_point;
    }

    if (unicode_code_point <= 0x377U)
    {
      if ( 0x0374U ==unicode_code_point || 0x0375U ==unicode_code_point )
        return unicode_code_point;
      if (0 == (unicode_code_point % 2))
      {
        // GREEK CAPITAL LETTER
        if ( ON_StringMapOrdinalType::LowerOrdinal == map_type)
          return unicode_code_point+1;
      }
      else
      {
        // GREEK SMALL LETTER
        if ( ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::UpperOrdinal == map_type )
          return unicode_code_point-1;
      }
      return unicode_code_point;
    }

    if (unicode_code_point <= 0x037DU)
    {
      if (ON_StringMapOrdinalType::UpperOrdinal == map_type && unicode_code_point >= 0x037BU )
        return unicode_code_point + (0x03FDU - 0x037BU);
      return unicode_code_point;
    }

    if (unicode_code_point == 0x037FU || unicode_code_point == 0x03F3U )
    {
      if ( unicode_code_point == 0x037FU && ON_StringMapOrdinalType::LowerOrdinal == map_type )
        return 0x03F3U;
      if ( unicode_code_point == 0x03F3U && ( ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::UpperOrdinal == map_type ) )
        return 0x03F3U;
      return unicode_code_point;
    }

    return unicode_code_point;
  }

  if ( unicode_code_point < 0x0400 )
    return unicode_code_point;

  if ( unicode_code_point <= 0x04FFU )
  {
    // Cyrillic
    if ( unicode_code_point < 0x0410U )
      return unicode_code_point;

    if (unicode_code_point <= 0x042FU)
    {
      // 0x0410: CYRILLIC CAPITAL LETTER A
      // 0x042F: CYRILLIC CAPITAL LETTER YA
      if ( ON_StringMapOrdinalType::LowerOrdinal == map_type )
        return unicode_code_point + 0x20;
      return unicode_code_point;
    }

    if (unicode_code_point <= 0x044FU)
    {
      // 0x0430: CYRILLIC SMALL LETTER A -> CYRILLIC CAPITAL LETTER A
      // 0x044F: CYRILLIC SMALL LETTER YA -> CYRILLIC CAPITAL LETTER YA
      if ( ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::UpperOrdinal == map_type )
        return unicode_code_point - 0x20;
      return unicode_code_point;
    }

    return unicode_code_point;
  }

  if (unicode_code_point < 0xD800)
  {
    // TODO - deal with other codepoint values < 0xD800
    //  That should be reduced for ordinal ignore case compares
    return unicode_code_point;
  }

  if (unicode_code_point < 0xFF00U)
  {
    // surrogate pairs use values from 0xD800U to 0xDFFF
    //   No ordinal ignore conversion applies to surrogate pair values.
    //
    // 0xE000 to 0xF8FF = unicode private use area
    //   No ordinal ignore conversion applies to private use area values.
  }

  if (unicode_code_point < 0xF900)
  {
    // 0xF900 to 0xFAFF = CJK Compatibility Ideographs
    // 0xFB00... = Alphabetic Presentation Forms
    // ...
    // 0xFE00... = Variation Selectors
    return unicode_code_point;
  }

  if (unicode_code_point <= 0xFFEFU)
  {
    // Halfwidth and Fullwidth Forms
    if ( unicode_code_point < 0xFF21 )
      return unicode_code_point;

    if (unicode_code_point <= 0xFF3A)
    {
      // 0xFF22: FULLWIDTH LATIN CAPITAL LETTER A
      // 0xFF3A: FULLWIDTH LATIN CAPITAL LETTER Z
      if (ON_StringMapOrdinalType::LowerOrdinal == map_type)
      {
        return unicode_code_point + 0x20;
      }
      return unicode_code_point;
    }

    if (unicode_code_point <= 0xFF41)
      return unicode_code_point;

    if (unicode_code_point <= 0xFF5A)
    {
      if (ON_StringMapOrdinalType::MinimumOrdinal == map_type || ON_StringMapOrdinalType::UpperOrdinal == map_type)
      {
        // 0xFF41: FULLWIDTH LATIN SMALL LETTER A -> FULLWIDTH LATIN CAPITAL LETTER A
        // 0xFF5A: FULLWIDTH LATIN SMALL LETTER Z -> FULLWIDTH LATIN CAPITAL LETTER Z
        return unicode_code_point - 0x20;
      }
      return unicode_code_point;
    }

    return unicode_code_point;
  }

  // 0x10000U: Linear B Syllabary
  // 0x10100U: Aegean Numbers
  // ...
  // 0x10FFFFU: maximum valid unicode code point

  return unicode_code_point;
}